

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec_tracker.cpp
# Opt level: O3

void __thiscall despot::ExecTracker::PrintLocs(ExecTracker *this,ostream *out)

{
  mapped_type_conflict *pmVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  _Self __tmp_1;
  _Rb_tree_header *p_Var5;
  _Self __tmp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  locs;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (this->creation_loc_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->creation_loc_)._M_t._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var2 != p_Var5) {
    do {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_60,(key_type *)(p_Var2 + 2));
      *pmVar1 = *pmVar1 + 1;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Locs:",5);
  p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out," (",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,p_Var4[2]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void ExecTracker::PrintLocs(ostream& out) const {
	map<string, int> locs;
	for (map<string, string>::const_iterator it = creation_loc_.begin();
		it != creation_loc_.end(); it++) {
		locs[it->second]++;
	}
	out << "Locs:";
	for (map<string, int>::iterator loc = locs.begin(); loc != locs.end(); loc++)
		out << " (" << loc->first << ", " << loc->second << ")";
	out << endl;
}